

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktFragmentOperationsScissorTests.cpp
# Opt level: O2

TestStatus *
vkt::FragmentOperations::anon_unknown_0::test
          (TestStatus *__return_storage_ptr__,Context *context,CaseDef *caseDef)

{
  void **this;
  ProgramCollection<vk::ProgramBinary> *pPVar1;
  TestLog *log;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> data;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> data_00;
  VkImageSubresourceRange subresourceRange;
  deUint32 dVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  Context *pCVar6;
  CaseDef *pCVar7;
  TestStatus *__return_storage_ptr___00;
  TestPrimitive TVar8;
  bool bVar9;
  int iVar10;
  deUint32 dVar11;
  int iVar12;
  DeviceInterface *pDVar13;
  VkDevice pVVar14;
  Allocator *pAVar15;
  TextureFormat format;
  DeviceInterface *vk;
  ProgramBinary *pPVar16;
  ConstPixelBufferAccess *this_00;
  int iVar17;
  int x;
  int iVar18;
  VkDeviceSize bufferSize;
  int y;
  int y_00;
  float x_00;
  float fVar19;
  float fVar20;
  float y_01;
  float fVar21;
  float fVar22;
  undefined4 in_stack_fffffffffffffb98;
  undefined4 in_stack_fffffffffffffb9c;
  undefined4 in_stack_fffffffffffffba0;
  undefined4 in_stack_fffffffffffffba4;
  Random rng;
  VkImageCreateInfo imageParams;
  IVec2 renderSize;
  string local_388;
  undefined4 local_368;
  Context *local_358;
  CaseDef *local_350;
  UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> colorBufferScissoredAlloc;
  UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> colorBufferFullAlloc;
  RefBase<vk::Handle<(vk::HandleType)17>_> local_328;
  TestStatus *local_300;
  VkDevice local_2f8;
  DeviceInterface *local_2f0;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  int local_2d8;
  RefBase<vk::Handle<(vk::HandleType)8>_> local_2c8;
  RefBase<vk::Handle<(vk::HandleType)8>_> local_2a8;
  undefined1 local_288 [20];
  CaseDef local_274;
  ConstPixelBufferAccess resultImage;
  Vector<float,_4> local_220;
  vector<vkt::FragmentOperations::(anonymous_namespace)::VertexData,_std::allocator<vkt::FragmentOperations::(anonymous_namespace)::VertexData>_>
  local_210;
  VkDeviceSize local_1f8;
  VkPrimitiveTopology local_1f0;
  RefBase<vk::Handle<(vk::HandleType)9>_> local_1e8;
  UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> local_1c8;
  RefBase<vk::Handle<(vk::HandleType)13>_> local_1b8;
  RefBase<vk::Handle<(vk::HandleType)8>_> local_198;
  UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> local_178;
  RefBase<vk::Handle<(vk::HandleType)14>_> local_168;
  RefBase<vk::Handle<(vk::HandleType)14>_> local_148;
  RefBase<vk::Handle<(vk::HandleType)17>_> local_128;
  RefBase<vk::Handle<(vk::HandleType)23>_> local_108;
  RefBase<vk::Handle<(vk::HandleType)16>_> local_e8;
  RefBase<vk::Handle<(vk::HandleType)24>_> local_c8;
  RefBase<vk::VkCommandBuffer_s_*> local_a8;
  undefined1 *local_88;
  undefined1 *puStack_80;
  undefined1 local_78 [24];
  ConstPixelBufferAccess local_60;
  VkAttachmentReference colorAttachmentRef;
  
  local_350 = caseDef;
  local_300 = __return_storage_ptr__;
  pDVar13 = Context::getDeviceInterface(context);
  pVVar14 = Context::getDevice(context);
  local_358 = context;
  pAVar15 = Context::getDefaultAllocator(context);
  renderSize.m_data[0] = 0x80;
  renderSize.m_data[1] = 0x80;
  local_78._0_4_ = 0.0;
  local_78._4_4_ = 0.0;
  local_78._8_8_ = &DAT_3f8000003f800000;
  local_88 = &DAT_3f8000003f800000;
  puStack_80 = &DAT_3f8000003f800000;
  local_288._0_4_ = 0.5;
  local_288._4_4_ = 0.5;
  local_288._8_8_ = &DAT_3f8000003f800000;
  format = ::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
  iVar10 = tcu::getPixelSize(format);
  bufferSize = (VkDeviceSize)(iVar10 << 0xe);
  makeBufferCreateInfo((VkBufferCreateInfo *)&resultImage,bufferSize,2);
  makeBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)&imageParams,pDVar13,pVVar14,
             (VkBufferCreateInfo *)&resultImage);
  local_2a8.m_data.deleter.m_device = (VkDevice)imageParams._16_8_;
  local_2a8.m_data.object.m_internal = imageParams._0_8_;
  local_2a8.m_data.deleter.m_deviceIface = (DeviceInterface *)imageParams.pNext;
  imageParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  imageParams._4_4_ = 0;
  imageParams.pNext = (void *)0x0;
  imageParams.flags = 0;
  imageParams.imageType = VK_IMAGE_TYPE_1D;
  imageParams.format = VK_FORMAT_UNDEFINED;
  imageParams.extent.width = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)8>_> *)&imageParams);
  bindBuffer((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&resultImage,pDVar13,
             pVVar14,pAVar15,(VkBuffer)local_2a8.m_data.object.m_internal,(MemoryRequirement)0x1);
  colorBufferFullAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
  ptr = (Allocation *)resultImage.m_format;
  resultImage.m_format.order = R;
  resultImage.m_format.type = SNORM_INT8;
  de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniqueBase
            ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&resultImage);
  makeBufferCreateInfo((VkBufferCreateInfo *)&resultImage,bufferSize,2);
  makeBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)&imageParams,pDVar13,pVVar14,
             (VkBufferCreateInfo *)&resultImage);
  local_2c8.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)CONCAT44(imageParams.extent.width,imageParams.format);
  local_2c8.m_data.deleter.m_device = (VkDevice)imageParams._16_8_;
  local_2c8.m_data.object.m_internal = imageParams._0_8_;
  local_2c8.m_data.deleter.m_deviceIface = (DeviceInterface *)imageParams.pNext;
  imageParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  imageParams._4_4_ = 0;
  imageParams.pNext = (void *)0x0;
  imageParams.flags = 0;
  imageParams.imageType = VK_IMAGE_TYPE_1D;
  imageParams.format = VK_FORMAT_UNDEFINED;
  imageParams.extent.width = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)8>_> *)&imageParams);
  bindBuffer((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&resultImage,pDVar13,
             pVVar14,pAVar15,(VkBuffer)local_2c8.m_data.object.m_internal,(MemoryRequirement)0x1);
  colorBufferScissoredAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
  m_data.ptr = (Allocation *)resultImage.m_format;
  resultImage.m_format.order = R;
  resultImage.m_format.type = SNORM_INT8;
  de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniqueBase
            ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&resultImage);
  zeroBuffer(pDVar13,pVVar14,
             colorBufferFullAlloc.
             super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr,
             bufferSize);
  zeroBuffer(pDVar13,pVVar14,
             colorBufferScissoredAlloc.
             super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr,
             bufferSize);
  local_2f8 = pVVar14;
  local_2f0 = pDVar13;
  CaseDef::CaseDef(&local_274,local_350);
  tcu::Vector<int,_2>::Vector((Vector<int,_2> *)&resultImage,&renderSize);
  resultImage.m_size.m_data[0] = 0x25;
  resultImage.m_size.m_data[1] = 1;
  resultImage.m_size.m_data[2] = 0;
  resultImage.m_pitch.m_data[0] = 1;
  resultImage.m_pitch.m_data[1] = 0;
  resultImage.m_pitch.m_data[2] = 1;
  this = &resultImage.m_data;
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)this,(Vector<float,_4> *)&local_88);
  tcu::Vector<float,_4>::Vector(&local_220,(Vector<float,_4> *)local_288);
  TVar8 = local_274.primitive;
  local_210.
  super__Vector_base<vkt::FragmentOperations::(anonymous_namespace)::VertexData,_std::allocator<vkt::FragmentOperations::(anonymous_namespace)::VertexData>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_210.
  super__Vector_base<vkt::FragmentOperations::(anonymous_namespace)::VertexData,_std::allocator<vkt::FragmentOperations::(anonymous_namespace)::VertexData>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_210.
  super__Vector_base<vkt::FragmentOperations::(anonymous_namespace)::VertexData,_std::allocator<vkt::FragmentOperations::(anonymous_namespace)::VertexData>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  deRandom_init(&rng.m_rnd,0x4d2);
  if (TVar8 < (TEST_PRIMITIVE_BIG_TRIANGLE|TEST_PRIMITIVE_LINES)) {
    x_00 = local_274.renderArea.m_data[0] + local_274.renderArea.m_data[0] + -1.0;
    y_01 = local_274.renderArea.m_data[1] + local_274.renderArea.m_data[1] + -1.0;
    fVar22 = local_274.renderArea.m_data[2] + local_274.renderArea.m_data[2];
    fVar21 = local_274.renderArea.m_data[3] + local_274.renderArea.m_data[3];
    switch(TVar8) {
    case TEST_PRIMITIVE_POINTS:
      for (iVar10 = TVar8 - 0x32; iVar10 != 0; iVar10 = iVar10 + 1) {
        fVar19 = deRandom_getFloat(&rng.m_rnd);
        fVar20 = deRandom_getFloat(&rng.m_rnd);
        makeVertex((VertexData *)&imageParams,fVar19 * fVar22 + 0.0 + x_00,
                   fVar20 * fVar21 + 0.0 + y_01,(Vec4 *)this);
        std::
        vector<vkt::FragmentOperations::(anonymous_namespace)::VertexData,_std::allocator<vkt::FragmentOperations::(anonymous_namespace)::VertexData>_>
        ::push_back(&local_210,(value_type *)&imageParams);
      }
      break;
    case TEST_PRIMITIVE_LINES:
      iVar10 = 0x1e;
      while (bVar9 = iVar10 != 0, iVar10 = iVar10 + -1, bVar9) {
        fVar19 = deRandom_getFloat(&rng.m_rnd);
        fVar20 = deRandom_getFloat(&rng.m_rnd);
        fVar19 = fVar19 * (fVar22 + -0.2) + 0.0 + x_00;
        fVar20 = fVar20 * (fVar21 + -0.2) + 0.0 + y_01;
        makeVertex((VertexData *)&imageParams,fVar19,fVar20,(Vec4 *)this);
        std::
        vector<vkt::FragmentOperations::(anonymous_namespace)::VertexData,_std::allocator<vkt::FragmentOperations::(anonymous_namespace)::VertexData>_>
        ::push_back(&local_210,(value_type *)&imageParams);
        makeVertex((VertexData *)&imageParams,fVar19 + 0.2,fVar20 + 0.2,(Vec4 *)this);
        std::
        vector<vkt::FragmentOperations::(anonymous_namespace)::VertexData,_std::allocator<vkt::FragmentOperations::(anonymous_namespace)::VertexData>_>
        ::push_back(&local_210,(value_type *)&imageParams);
      }
      break;
    case TEST_PRIMITIVE_TRIANGLES:
      iVar10 = 0x14;
      while (bVar9 = iVar10 != 0, iVar10 = iVar10 + -1, bVar9) {
        fVar19 = deRandom_getFloat(&rng.m_rnd);
        fVar20 = deRandom_getFloat(&rng.m_rnd);
        fVar19 = fVar19 * (fVar22 + -0.2) + 0.0 + x_00;
        fVar20 = fVar20 * (fVar21 + -0.2) + 0.0 + y_01;
        makeVertex((VertexData *)&imageParams,fVar19,fVar20,(Vec4 *)this);
        std::
        vector<vkt::FragmentOperations::(anonymous_namespace)::VertexData,_std::allocator<vkt::FragmentOperations::(anonymous_namespace)::VertexData>_>
        ::push_back(&local_210,(value_type *)&imageParams);
        makeVertex((VertexData *)&imageParams,fVar19 + 0.1,fVar20 + 0.2,(Vec4 *)this);
        std::
        vector<vkt::FragmentOperations::(anonymous_namespace)::VertexData,_std::allocator<vkt::FragmentOperations::(anonymous_namespace)::VertexData>_>
        ::push_back(&local_210,(value_type *)&imageParams);
        makeVertex((VertexData *)&imageParams,fVar19 + 0.2,fVar20,(Vec4 *)this);
        std::
        vector<vkt::FragmentOperations::(anonymous_namespace)::VertexData,_std::allocator<vkt::FragmentOperations::(anonymous_namespace)::VertexData>_>
        ::push_back(&local_210,(value_type *)&imageParams);
      }
      break;
    case TEST_PRIMITIVE_BIG_LINE:
      makeVertex((VertexData *)&imageParams,x_00,y_01,(Vec4 *)this);
      std::
      vector<vkt::FragmentOperations::(anonymous_namespace)::VertexData,_std::allocator<vkt::FragmentOperations::(anonymous_namespace)::VertexData>_>
      ::push_back(&local_210,(value_type *)&imageParams);
      makeVertex((VertexData *)&imageParams,x_00 + fVar22,y_01 + fVar21,(Vec4 *)this);
      std::
      vector<vkt::FragmentOperations::(anonymous_namespace)::VertexData,_std::allocator<vkt::FragmentOperations::(anonymous_namespace)::VertexData>_>
      ::push_back(&local_210,(value_type *)&imageParams);
      break;
    case TEST_PRIMITIVE_BIG_TRIANGLE:
      makeVertex((VertexData *)&imageParams,x_00,y_01,(Vec4 *)this);
      std::
      vector<vkt::FragmentOperations::(anonymous_namespace)::VertexData,_std::allocator<vkt::FragmentOperations::(anonymous_namespace)::VertexData>_>
      ::push_back(&local_210,(value_type *)&imageParams);
      makeVertex((VertexData *)&imageParams,fVar22 * 0.5 + x_00,fVar21 + y_01,(Vec4 *)this);
      std::
      vector<vkt::FragmentOperations::(anonymous_namespace)::VertexData,_std::allocator<vkt::FragmentOperations::(anonymous_namespace)::VertexData>_>
      ::push_back(&local_210,(value_type *)&imageParams);
      makeVertex((VertexData *)&imageParams,x_00 + fVar22,y_01,(Vec4 *)this);
      std::
      vector<vkt::FragmentOperations::(anonymous_namespace)::VertexData,_std::allocator<vkt::FragmentOperations::(anonymous_namespace)::VertexData>_>
      ::push_back(&local_210,(value_type *)&imageParams);
    }
  }
  local_1f8 = (long)local_210.
                    super__Vector_base<vkt::FragmentOperations::(anonymous_namespace)::VertexData,_std::allocator<vkt::FragmentOperations::(anonymous_namespace)::VertexData>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_210.
                    super__Vector_base<vkt::FragmentOperations::(anonymous_namespace)::VertexData,_std::allocator<vkt::FragmentOperations::(anonymous_namespace)::VertexData>_>
                    ._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)local_274.primitive < 5) {
    local_1f0 = *(VkPrimitiveTopology *)(&DAT_009c9614 + (ulong)local_274.primitive * 4);
  }
  else {
    local_1f0 = VK_PRIMITIVE_TOPOLOGY_LAST;
  }
  local_1e8.m_data.object.m_internal = 0;
  local_1e8.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_1c8.m_data.ptr = (Allocation *)0x0;
  local_1e8.m_data.deleter.m_device = (VkDevice)0x0;
  local_1e8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  local_1b8.m_data.object.m_internal = 0;
  local_1b8.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_1b8.m_data.deleter.m_device = (VkDevice)0x0;
  local_1b8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  local_198.m_data.object.m_internal = 0;
  local_198.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_198.m_data.deleter.m_device = (VkDevice)0x0;
  local_198.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  local_178.m_data.ptr = (Allocation *)0x0;
  memset(&local_168,0,0xe0);
  pCVar6 = local_358;
  vk = Context::getDeviceInterface(local_358);
  pVVar14 = Context::getDevice(pCVar6);
  dVar11 = Context::getUniversalQueueFamilyIndex(pCVar6);
  pAVar15 = Context::getDefaultAllocator(pCVar6);
  imageParams.sType = VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO;
  imageParams.pNext = (void *)0x0;
  imageParams.flags = 0;
  imageParams.imageType = VK_IMAGE_TYPE_2D;
  imageParams.format = resultImage.m_size.m_data[0];
  imageParams.extent.width = resultImage.m_format.order;
  imageParams.extent.height = resultImage.m_format.type;
  imageParams.extent.depth = 1;
  imageParams.mipLevels = 1;
  imageParams.arrayLayers = 1;
  imageParams.samples = VK_SAMPLE_COUNT_1_BIT;
  imageParams.tiling = VK_IMAGE_TILING_OPTIMAL;
  imageParams.usage = 0x11;
  imageParams.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
  imageParams.queueFamilyIndexCount = 0;
  imageParams.pQueueFamilyIndices = (deUint32 *)0x0;
  imageParams.initialLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  makeImage((Move<vk::Handle<(vk::HandleType)9>_> *)&local_388,vk,pVVar14,&imageParams);
  uVar5 = local_388.field_2._8_8_;
  uVar3 = local_388.field_2._M_allocated_capacity;
  rng.m_rnd._0_8_ = local_388._M_dataplus._M_p;
  rng.m_rnd.z = (undefined4)local_388._M_string_length;
  rng.m_rnd.w = local_388._M_string_length._4_4_;
  local_388._M_dataplus._M_p = (pointer)0x0;
  local_388._M_string_length = 0;
  local_388.field_2._M_allocated_capacity = 0;
  local_388.field_2._8_8_ = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::reset(&local_1e8);
  local_1e8.m_data.deleter.m_device = (VkDevice)uVar3;
  local_1e8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)uVar5;
  local_1e8.m_data.object.m_internal._0_4_ = rng.m_rnd.x;
  local_1e8.m_data.object.m_internal._4_4_ = rng.m_rnd.y;
  local_1e8.m_data.deleter.m_deviceIface = (DeviceInterface *)rng.m_rnd._8_8_;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)9>_> *)&local_388);
  bindImage((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&imageParams,vk,pVVar14,
            pAVar15,(VkImage)local_1e8.m_data.object.m_internal,(MemoryRequirement)0x0);
  imageParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  imageParams._4_4_ = 0;
  data.ptr._4_4_ = in_stack_fffffffffffffb9c;
  data.ptr._0_4_ = in_stack_fffffffffffffb98;
  data._8_4_ = in_stack_fffffffffffffba0;
  data._12_4_ = in_stack_fffffffffffffba4;
  de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::assignData
            (&local_1c8,data);
  de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniqueBase
            ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&imageParams);
  local_2e8 = CONCAT44(resultImage.m_size.m_data[2],resultImage.m_size.m_data[1]);
  uStack_2e0 = CONCAT44(resultImage.m_pitch.m_data[1],resultImage.m_pitch.m_data[0]);
  local_2d8 = resultImage.m_pitch.m_data[2];
  subresourceRange.baseMipLevel = resultImage.m_size.m_data[2];
  subresourceRange.aspectMask = resultImage.m_size.m_data[1];
  subresourceRange.levelCount = resultImage.m_pitch.m_data[0];
  subresourceRange.baseArrayLayer = resultImage.m_pitch.m_data[1];
  subresourceRange.layerCount = resultImage.m_pitch.m_data[2];
  iVar10 = resultImage.m_size.m_data[1];
  iVar18 = resultImage.m_size.m_data[2];
  iVar12 = resultImage.m_pitch.m_data[0];
  iVar17 = resultImage.m_pitch.m_data[1];
  makeImageView((Move<vk::Handle<(vk::HandleType)13>_> *)&rng,vk,pVVar14,
                (VkImage)local_1e8.m_data.object.m_internal,VK_IMAGE_VIEW_TYPE_2D,
                resultImage.m_size.m_data[0],subresourceRange);
  uVar4 = local_388.field_2._M_allocated_capacity;
  local_388.field_2._M_allocated_capacity._0_4_ = (undefined4)uVar3;
  local_388.field_2._M_allocated_capacity._4_4_ = SUB84(uVar3,4);
  imageParams.flags = local_388.field_2._M_allocated_capacity._0_4_;
  imageParams.imageType = local_388.field_2._M_allocated_capacity._4_4_;
  imageParams.format = (VkFormat)uVar5;
  imageParams.extent.width = (deUint32)((ulong)uVar5 >> 0x20);
  imageParams.sType = rng.m_rnd.x;
  imageParams._4_4_ = rng.m_rnd.y;
  imageParams.pNext = (void *)rng.m_rnd._8_8_;
  rng.m_rnd.x = 0;
  rng.m_rnd.y = 0;
  rng.m_rnd.z = 0;
  rng.m_rnd.w = 0;
  local_388.field_2._M_allocated_capacity = uVar4;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::reset(&local_1b8);
  local_1b8.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)CONCAT44(imageParams.extent.width,imageParams.format);
  local_1b8.m_data.deleter.m_device = (VkDevice)imageParams._16_8_;
  local_1b8.m_data.object.m_internal = imageParams._0_8_;
  local_1b8.m_data.deleter.m_deviceIface = (DeviceInterface *)imageParams.pNext;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)13>_> *)&rng);
  makeBufferCreateInfo((VkBufferCreateInfo *)&imageParams,local_1f8,0x80);
  pCVar6 = local_358;
  makeBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)&local_388,vk,pVVar14,
             (VkBufferCreateInfo *)&imageParams);
  uVar5 = local_388.field_2._8_8_;
  uVar3 = local_388.field_2._M_allocated_capacity;
  rng.m_rnd._0_8_ = local_388._M_dataplus._M_p;
  rng.m_rnd.z = (undefined4)local_388._M_string_length;
  rng.m_rnd.w = local_388._M_string_length._4_4_;
  local_388._M_dataplus._M_p = (pointer)0x0;
  local_388._M_string_length = 0;
  local_388.field_2._M_allocated_capacity = 0;
  local_388.field_2._8_8_ = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::reset(&local_198);
  local_198.m_data.deleter.m_device = (VkDevice)uVar3;
  local_198.m_data.deleter.m_allocator = (VkAllocationCallbacks *)uVar5;
  local_198.m_data.object.m_internal._0_4_ = rng.m_rnd.x;
  local_198.m_data.object.m_internal._4_4_ = rng.m_rnd.y;
  local_198.m_data.deleter.m_deviceIface = (DeviceInterface *)rng.m_rnd._8_8_;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)8>_> *)&local_388);
  bindBuffer((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&imageParams,vk,pVVar14
             ,pAVar15,(VkBuffer)local_198.m_data.object.m_internal,(MemoryRequirement)0x1);
  imageParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  imageParams._4_4_ = 0;
  data_00.ptr._4_4_ = iVar18;
  data_00.ptr._0_4_ = iVar10;
  data_00._8_4_ = iVar12;
  data_00._12_4_ = iVar17;
  de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::assignData
            (&local_178,data_00);
  de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniqueBase
            ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&imageParams);
  memcpy((local_178.m_data.ptr)->m_hostPtr,
         local_210.
         super__Vector_base<vkt::FragmentOperations::(anonymous_namespace)::VertexData,_std::allocator<vkt::FragmentOperations::(anonymous_namespace)::VertexData>_>
         ._M_impl.super__Vector_impl_data._M_start,local_1f8);
  ::vk::flushMappedMemoryRange
            (vk,pVVar14,(VkDeviceMemory)((local_178.m_data.ptr)->m_memory).m_internal,
             (local_178.m_data.ptr)->m_offset,local_1f8);
  pPVar1 = pCVar6->m_progCollection;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_388,"vert",(allocator<char> *)&local_328);
  pPVar16 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar1,&local_388);
  ::vk::createShaderModule((Move<vk::Handle<(vk::HandleType)14>_> *)&rng,vk,pVVar14,pPVar16,0);
  uVar4 = local_388.field_2._M_allocated_capacity;
  local_388.field_2._M_allocated_capacity._0_4_ = (undefined4)uVar3;
  local_388.field_2._M_allocated_capacity._4_4_ = SUB84(uVar3,4);
  imageParams.flags = local_388.field_2._M_allocated_capacity._0_4_;
  imageParams.imageType = local_388.field_2._M_allocated_capacity._4_4_;
  imageParams.format = (VkFormat)uVar5;
  imageParams.extent.width = (deUint32)((ulong)uVar5 >> 0x20);
  imageParams.sType = rng.m_rnd.x;
  imageParams._4_4_ = rng.m_rnd.y;
  imageParams.pNext = (void *)rng.m_rnd._8_8_;
  rng.m_rnd.x = 0;
  rng.m_rnd.y = 0;
  rng.m_rnd.z = 0;
  rng.m_rnd.w = 0;
  local_388.field_2._M_allocated_capacity = uVar4;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::reset(&local_168);
  local_168.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)CONCAT44(imageParams.extent.width,imageParams.format);
  local_168.m_data.deleter.m_device = (VkDevice)imageParams._16_8_;
  local_168.m_data.object.m_internal = imageParams._0_8_;
  local_168.m_data.deleter.m_deviceIface = (DeviceInterface *)imageParams.pNext;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)14>_> *)&rng);
  std::__cxx11::string::~string((string *)&local_388);
  pPVar1 = pCVar6->m_progCollection;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_388,"frag",(allocator<char> *)&local_328);
  pPVar16 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar1,&local_388);
  ::vk::createShaderModule((Move<vk::Handle<(vk::HandleType)14>_> *)&rng,vk,pVVar14,pPVar16,0);
  imageParams.flags = 0;
  imageParams.imageType = VK_IMAGE_TYPE_1D;
  imageParams.format = VK_FORMAT_UNDEFINED;
  imageParams.extent.width = 0;
  imageParams.sType = rng.m_rnd.x;
  imageParams._4_4_ = rng.m_rnd.y;
  imageParams.pNext = (void *)rng.m_rnd._8_8_;
  rng.m_rnd.x = 0;
  rng.m_rnd.y = 0;
  rng.m_rnd.z = 0;
  rng.m_rnd.w = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::reset(&local_148);
  local_148.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)CONCAT44(imageParams.extent.width,imageParams.format);
  local_148.m_data.deleter.m_device = (VkDevice)imageParams._16_8_;
  local_148.m_data.object.m_internal = imageParams._0_8_;
  local_148.m_data.deleter.m_deviceIface = (DeviceInterface *)imageParams.pNext;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)14>_> *)&rng);
  std::__cxx11::string::~string((string *)&local_388);
  local_388._M_dataplus._M_p = (pointer)((ulong)(uint)resultImage.m_size.m_data[0] << 0x20);
  local_388._M_string_length = 0x100000001;
  local_388.field_2._M_allocated_capacity = 0x200000000;
  local_388.field_2._8_8_ = 1;
  local_368 = 2;
  imageParams.extent._4_8_ = &colorAttachmentRef;
  colorAttachmentRef.attachment = 0;
  colorAttachmentRef.layout = VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL;
  imageParams.flags = 0;
  imageParams.imageType = VK_IMAGE_TYPE_1D;
  imageParams.extent.width = 0;
  imageParams.mipLevels = 0;
  imageParams.arrayLayers = 0;
  imageParams.samples = 0;
  imageParams.tiling = VK_IMAGE_TILING_OPTIMAL;
  imageParams.usage = 0;
  imageParams.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
  imageParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  imageParams._4_4_ = 0;
  imageParams.pNext = (void *)0x0;
  imageParams.queueFamilyIndexCount = 0;
  imageParams._68_4_ = 0;
  rng.m_rnd.x = 0x26;
  rng.m_rnd.z = 0;
  rng.m_rnd.w = 0;
  imageParams.format = VK_FORMAT_R4G4_UNORM_PACK8;
  ::vk::createRenderPass
            ((Move<vk::Handle<(vk::HandleType)17>_> *)&local_328,vk,pVVar14,
             (VkRenderPassCreateInfo *)&rng,(VkAllocationCallbacks *)0x0);
  imageParams._16_8_ = local_328.m_data.deleter.m_device;
  imageParams.format = (VkFormat)local_328.m_data.deleter.m_allocator;
  imageParams.extent.width = (deUint32)((ulong)local_328.m_data.deleter.m_allocator >> 0x20);
  imageParams._0_8_ = local_328.m_data.object.m_internal;
  imageParams.pNext = local_328.m_data.deleter.m_deviceIface;
  local_328.m_data.object.m_internal = 0;
  local_328.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_328.m_data.deleter.m_device = (VkDevice)0x0;
  local_328.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::reset(&local_128);
  pDVar13 = local_2f0;
  pCVar7 = local_350;
  local_128.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)CONCAT44(imageParams.extent.width,imageParams.format);
  local_128.m_data.deleter.m_device = (VkDevice)imageParams._16_8_;
  local_128.m_data.object.m_internal = imageParams._0_8_;
  local_128.m_data.deleter.m_deviceIface = (DeviceInterface *)imageParams.pNext;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::~RefBase(&local_328);
  makeFramebuffer((Move<vk::Handle<(vk::HandleType)23>_> *)&rng,vk,pVVar14,
                  (VkRenderPass)local_128.m_data.object.m_internal,1,(VkImageView *)&local_1b8,
                  resultImage.m_format.order,resultImage.m_format.type,1);
  imageParams.flags = 0;
  imageParams.imageType = VK_IMAGE_TYPE_2D;
  imageParams.sType = rng.m_rnd.x;
  imageParams._4_4_ = rng.m_rnd.y;
  imageParams.pNext = (void *)rng.m_rnd._8_8_;
  rng.m_rnd.x = 0;
  rng.m_rnd.y = 0;
  rng.m_rnd.z = 0;
  rng.m_rnd.w = 0;
  imageParams._24_8_ = &local_388;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)23>_>::reset(&local_108);
  local_108.m_data.deleter.m_allocator = (VkAllocationCallbacks *)imageParams._24_8_;
  local_108.m_data.deleter.m_device = (VkDevice)imageParams._16_8_;
  local_108.m_data.object.m_internal = imageParams._0_8_;
  local_108.m_data.deleter.m_deviceIface = (DeviceInterface *)imageParams.pNext;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)23>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)23>_> *)&rng);
  makePipelineLayout((Move<vk::Handle<(vk::HandleType)16>_> *)&rng,vk,pVVar14);
  imageParams.flags = 0;
  imageParams.imageType = VK_IMAGE_TYPE_1D;
  imageParams.format = VK_FORMAT_UNDEFINED;
  imageParams.extent.width = 0;
  imageParams.sType = rng.m_rnd.x;
  imageParams._4_4_ = rng.m_rnd.y;
  imageParams.pNext = (void *)rng.m_rnd._8_8_;
  rng.m_rnd.x = 0;
  rng.m_rnd.y = 0;
  rng.m_rnd.z = 0;
  rng.m_rnd.w = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::reset(&local_e8);
  local_e8.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)CONCAT44(imageParams.extent.width,imageParams.format);
  local_e8.m_data.deleter.m_device = (VkDevice)imageParams._16_8_;
  local_e8.m_data.object.m_internal = imageParams._0_8_;
  local_e8.m_data.deleter.m_deviceIface = (DeviceInterface *)imageParams.pNext;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)16>_> *)&rng);
  ::vk::createCommandPool
            ((Move<vk::Handle<(vk::HandleType)24>_> *)&rng,vk,pVVar14,2,dVar11,
             (VkAllocationCallbacks *)0x0);
  imageParams.flags = 0;
  imageParams.imageType = VK_IMAGE_TYPE_1D;
  imageParams.format = VK_FORMAT_UNDEFINED;
  imageParams.extent.width = 0;
  imageParams.sType = rng.m_rnd.x;
  imageParams._4_4_ = rng.m_rnd.y;
  imageParams.pNext = (void *)rng.m_rnd._8_8_;
  rng.m_rnd.x = 0;
  rng.m_rnd.y = 0;
  rng.m_rnd.z = 0;
  rng.m_rnd.w = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::reset(&local_c8);
  local_c8.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)CONCAT44(imageParams.extent.width,imageParams.format);
  local_c8.m_data.deleter.m_device = (VkDevice)imageParams._16_8_;
  local_c8.m_data.object.m_internal = imageParams._0_8_;
  local_c8.m_data.deleter.m_deviceIface = (DeviceInterface *)imageParams.pNext;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)24>_> *)&rng);
  ::vk::allocateCommandBuffer
            ((Move<vk::VkCommandBuffer_s_*> *)&rng,vk,pVVar14,
             (VkCommandPool)local_c8.m_data.object.m_internal,VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  imageParams.flags = 0;
  imageParams.imageType = VK_IMAGE_TYPE_1D;
  imageParams.format = VK_FORMAT_UNDEFINED;
  imageParams.extent.width = 0;
  imageParams.sType = rng.m_rnd.x;
  imageParams._4_4_ = rng.m_rnd.y;
  imageParams.pNext = (void *)rng.m_rnd._8_8_;
  rng.m_rnd.x = 0;
  rng.m_rnd.y = 0;
  rng.m_rnd.z = 0;
  rng.m_rnd.w = 0;
  ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::reset(&local_a8);
  pCVar6 = local_358;
  local_a8.m_data.deleter.m_pool.m_internal = CONCAT44(imageParams.extent.width,imageParams.format);
  local_a8.m_data.deleter.m_device = (VkDevice)imageParams._16_8_;
  local_a8.m_data.object = (VkCommandBuffer_s *)imageParams._0_8_;
  local_a8.m_data.deleter.m_deviceIface = (DeviceInterface *)imageParams.pNext;
  ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase
            ((RefBase<vk::VkCommandBuffer_s_*> *)&rng);
  ScissorRenderer::draw
            ((ScissorRenderer *)&resultImage,pCVar6,(Vec4 *)local_78,
             (VkBuffer)local_2a8.m_data.object.m_internal);
  ScissorRenderer::draw
            ((ScissorRenderer *)&resultImage,pCVar6,&pCVar7->scissorArea,
             (VkBuffer)local_2c8.m_data.object.m_internal);
  ScissorRenderer::~ScissorRenderer((ScissorRenderer *)&resultImage);
  pVVar14 = local_2f8;
  ::vk::invalidateMappedMemoryRange
            (pDVar13,local_2f8,
             (VkDeviceMemory)
             ((colorBufferFullAlloc.
               super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_memory).m_internal,0,bufferSize);
  ::vk::invalidateMappedMemoryRange
            (pDVar13,pVVar14,
             (VkDeviceMemory)
             ((colorBufferScissoredAlloc.
               super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_memory).m_internal,0,bufferSize);
  imageParams._0_8_ = ::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            (&resultImage,(TextureFormat *)&imageParams,renderSize.m_data[0],renderSize.m_data[1],1,
             (colorBufferScissoredAlloc.
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_hostPtr);
  rng.m_rnd._0_8_ = ::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)&imageParams,(TextureFormat *)&rng,renderSize.m_data[0],
             renderSize.m_data[1],1,
             (colorBufferFullAlloc.
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_hostPtr);
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            (&local_60,(ConstPixelBufferAccess *)&imageParams);
  iVar18 = local_60.m_size.m_data[1];
  iVar10 = local_60.m_size.m_data[0];
  getAreaRect(&pCVar7->scissorArea,local_60.m_size.m_data[0],local_60.m_size.m_data[1]);
  dVar11 = rng.m_rnd.x;
  dVar2 = rng.m_rnd.y;
  iVar17 = rng.m_rnd.z + rng.m_rnd.x;
  iVar12 = rng.m_rnd.w + rng.m_rnd.y;
  for (y_00 = 0; y_00 < iVar18; y_00 = y_00 + 1) {
    for (iVar18 = 0; iVar18 < iVar10; iVar18 = iVar18 + 1) {
      if ((((iVar18 < (int)dVar11) || (iVar17 <= iVar18)) || (y_00 < (int)dVar2)) ||
         (iVar12 <= y_00)) {
        tcu::PixelBufferAccess::setPixel
                  ((PixelBufferAccess *)&local_60,(Vec4 *)local_288,iVar18,y_00,0);
        iVar10 = local_60.m_size.m_data[0];
      }
    }
    iVar18 = local_60.m_size.m_data[1];
  }
  log = local_358->m_testCtx->m_log;
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&rng,0.02);
  bVar9 = tcu::floatThresholdCompare
                    (log,"color","Image compare",(ConstPixelBufferAccess *)&imageParams,&resultImage
                     ,(Vector<float,_4> *)&rng,COMPARE_LOG_RESULT);
  __return_storage_ptr___00 = local_300;
  if (bVar9) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&resultImage,"OK",(allocator<char> *)&imageParams);
    tcu::TestStatus::pass(__return_storage_ptr___00,(string *)&resultImage);
    this_00 = &resultImage;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&rng,"Rendered image is not correct",(allocator<char> *)&local_388);
    tcu::TestStatus::fail(__return_storage_ptr___00,(string *)&rng);
    this_00 = (ConstPixelBufferAccess *)&rng;
  }
  std::__cxx11::string::~string((string *)this_00);
  de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniqueBase
            (&colorBufferScissoredAlloc.
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::~RefBase(&local_2c8);
  de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniqueBase
            (&colorBufferFullAlloc.
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::~RefBase(&local_2a8);
  return __return_storage_ptr___00;
}

Assistant:

tcu::TestStatus test (Context& context, const CaseDef caseDef)
{
	const DeviceInterface&			vk							= context.getDeviceInterface();
	const VkDevice					device						= context.getDevice();
	Allocator&						allocator					= context.getDefaultAllocator();

	const IVec2						renderSize					(128, 128);
	const VkFormat					colorFormat					= VK_FORMAT_R8G8B8A8_UNORM;
	const Vec4						scissorFullArea				(0.0f, 0.0f, 1.0f, 1.0f);
	const Vec4						primitiveColor				(1.0f, 1.0f, 1.0f, 1.0f);
	const Vec4						clearColor					(0.5f, 0.5f, 1.0f, 1.0f);

	const VkDeviceSize				colorBufferSize				= renderSize.x() * renderSize.y() * tcu::getPixelSize(mapVkFormat(colorFormat));
	const Unique<VkBuffer>			colorBufferFull				(makeBuffer(vk, device, makeBufferCreateInfo(colorBufferSize, VK_BUFFER_USAGE_TRANSFER_DST_BIT)));
	const UniquePtr<Allocation>		colorBufferFullAlloc		(bindBuffer(vk, device, allocator, *colorBufferFull, MemoryRequirement::HostVisible));

	const Unique<VkBuffer>			colorBufferScissored		(makeBuffer(vk, device, makeBufferCreateInfo(colorBufferSize, VK_BUFFER_USAGE_TRANSFER_DST_BIT)));
	const UniquePtr<Allocation>		colorBufferScissoredAlloc	(bindBuffer(vk, device, allocator, *colorBufferScissored, MemoryRequirement::HostVisible));

	zeroBuffer(vk, device, *colorBufferFullAlloc, colorBufferSize);
	zeroBuffer(vk, device, *colorBufferScissoredAlloc, colorBufferSize);

	// Draw
	{
		const ScissorRenderer renderer (context, caseDef, renderSize, colorFormat, primitiveColor, clearColor);

		renderer.draw(context, scissorFullArea, *colorBufferFull);
		renderer.draw(context, caseDef.scissorArea, *colorBufferScissored);
	}

	// Log image
	{
		invalidateMappedMemoryRange(vk, device, colorBufferFullAlloc->getMemory(), 0ull, colorBufferSize);
		invalidateMappedMemoryRange(vk, device, colorBufferScissoredAlloc->getMemory(), 0ull, colorBufferSize);

		const tcu::ConstPixelBufferAccess	resultImage		(mapVkFormat(colorFormat), renderSize.x(), renderSize.y(), 1u, colorBufferScissoredAlloc->getHostPtr());
		tcu::PixelBufferAccess				referenceImage	(mapVkFormat(colorFormat), renderSize.x(), renderSize.y(), 1u, colorBufferFullAlloc->getHostPtr());

		// Apply scissor to the full image, so we can compare it with the result image.
		applyScissor (referenceImage, caseDef.scissorArea, clearColor);

		// Images should now match.
		if (!tcu::floatThresholdCompare(context.getTestContext().getLog(), "color", "Image compare", referenceImage, resultImage, Vec4(0.02f), tcu::COMPARE_LOG_RESULT))
			return tcu::TestStatus::fail("Rendered image is not correct");
	}

	return tcu::TestStatus::pass("OK");
}